

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_profiler.hpp
# Opt level: O1

void __thiscall fp::collector::~collector(collector *this)

{
  rep_conflict rVar1;
  rep_conflict rVar2;
  uint_least64_t uVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  uVar3 = this->m_count;
  if (uVar3 != 0) {
    rVar1 = (this->m_thread_accumulator).rep_;
    auVar6._8_4_ = (int)(rVar1 >> 0x20);
    auVar6._0_8_ = rVar1;
    auVar6._12_4_ = 0x45300000;
    rVar2 = (this->m_steady_accumulator).rep_;
    auVar7._8_4_ = (int)(uVar3 >> 0x20);
    auVar7._0_8_ = uVar3;
    auVar7._12_4_ = 0x45300000;
    dVar8 = (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    printf((this->m_fmt)._M_dataplus._M_p,
           ((((double)CONCAT44(0x45300000,(int)(rVar2 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)rVar2) - 4503599627370496.0)) / 1000000.0) / dVar8,
           (((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)rVar1) - 4503599627370496.0)) / 1000000.0) / dVar8);
  }
  pcVar4 = (this->m_fmt)._M_dataplus._M_p;
  paVar5 = &(this->m_fmt).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~collector() noexcept
  {
    report();
  }